

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O3

void __thiscall Txid_TxidEmpty_Test::TestBody(Txid_TxidEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Txid txid;
  AssertHelper local_68;
  string local_60;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Txid local_30;
  int local_c;
  
  cfd::core::Txid::Txid(&local_30);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_60,&local_30);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            (local_40,"txid.GetHex().c_str()","\"\"",local_60._M_dataplus._M_p,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Txid::GetData((ByteData *)&local_60,&local_30);
  local_68.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&local_60);
  local_c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_40,"txid.GetData().GetDataSize()","0",(unsigned_long *)&local_68,&local_c);
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_60._M_dataplus._M_p,
                    local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30._vptr_Txid = (_func_int **)&PTR__Txid_007d4398;
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Txid, TxidEmpty) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  Txid txid;
  EXPECT_STREQ(txid.GetHex().c_str(), "");
  EXPECT_EQ(txid.GetData().GetDataSize(), 0);
}